

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::processQueryCommand(CoreBroker *this,ActionMessage *cmd)

{
  action_t aVar1;
  int iVar2;
  GlobalFederateId fedid;
  byte *pbVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  route_id rVar4;
  string *__str;
  mapped_type *this_00;
  key_type local_40;
  
  aVar1 = cmd->messageAction;
  if (aVar1 < cmd_broker_query) {
    if (aVar1 == cmd_set_global) {
      if ((this->super_BrokerBase).field_0x294 != '\x01') {
        iVar2 = (this->super_BrokerBase).global_broker_id_local.gid;
        if (((iVar2 != -2010000000) && (iVar2 != -1700000000)) && (iVar2 != 0)) {
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,cmd);
          return;
        }
        gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::
        push<helics::ActionMessage&>
                  ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,cmd);
        return;
      }
      __str = ActionMessage::getString_abi_cxx11_(cmd,0);
      pbVar3 = (cmd->payload).heap;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,pbVar3,pbVar3 + (cmd->payload).bufferSize);
      this_00 = CLI::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->global_values,&local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (aVar1 == cmd_query_reply) goto LAB_00341ab6;
      if (aVar1 == cmd_query) goto LAB_00341a4d;
    }
  }
  else if (aVar1 < cmd_broker_query_ordered) {
    if (aVar1 == cmd_broker_query) {
LAB_00341a75:
      if ((this->super_BrokerBase).field_0x295 == '\0') {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
        emplace_back<helics::ActionMessage>(&this->earlyMessages,cmd);
        return;
      }
      iVar2 = (cmd->dest_id).gid;
      if ((iVar2 != (this->super_BrokerBase).global_broker_id_local.gid) &&
         ((iVar2 != 0 || ((this->super_BrokerBase).field_0x294 == '\0')))) {
        routeMessage(this,cmd);
        return;
      }
      processLocalQuery(this,cmd);
      return;
    }
    if (aVar1 == cmd_query_ordered) {
LAB_00341a4d:
      processQuery(this,cmd);
      return;
    }
  }
  else {
    if (aVar1 == cmd_query_reply_ordered) {
LAB_00341ab6:
      fedid.gid = (cmd->dest_id).gid;
      if (fedid.gid != (this->super_BrokerBase).global_broker_id_local.gid) {
        rVar4 = getRoute(this,fedid);
        UNRECOVERED_JUMPTABLE = (this->super_Broker)._vptr_Broker[0x22];
        (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar4.rid,cmd,UNRECOVERED_JUMPTABLE);
        return;
      }
      processQueryResponse(this,cmd);
      return;
    }
    if (aVar1 == cmd_broker_query_ordered) goto LAB_00341a75;
  }
  return;
}

Assistant:

void CoreBroker::processQueryCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_BROKER_QUERY:
        case CMD_BROKER_QUERY_ORDERED:
            if (!connectionEstablished) {
                earlyMessages.push_back(std::move(cmd));
                break;
            }
            if (cmd.dest_id == global_broker_id_local ||
                (isRootc && cmd.dest_id == parent_broker_id)) {
                processLocalQuery(cmd);
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_QUERY:
        case CMD_QUERY_ORDERED:
            processQuery(cmd);
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        case CMD_SET_GLOBAL:
            if (isRootc) {
                global_values[std::string(cmd.payload.to_string())] = cmd.getString(0);
            } else {
                if ((global_broker_id_local.isValid()) &&
                    (global_broker_id_local != parent_broker_id)) {
                    transmit(parent_route_id, cmd);
                } else {
                    // delay the response if we are not fully registered yet
                    delayTransmitQueue.push(cmd);
                }
            }
            break;
        default:
            break;
    }
}